

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O3

PHYSFS_sint64 UNPK_read(PHYSFS_Io *io,void *buffer,PHYSFS_uint64 len)

{
  long *plVar1;
  ulong uVar2;
  PHYSFS_sint64 PVar3;
  
  plVar1 = (long *)io->opaque;
  uVar2 = *(long *)(plVar1[1] + 0x30) - (ulong)*(uint *)(plVar1 + 2);
  if (uVar2 < len) {
    len = uVar2;
  }
  PVar3 = (**(code **)(*plVar1 + 0x10))(*plVar1,buffer,len);
  if (0 < PVar3) {
    *(int *)(plVar1 + 2) = (int)plVar1[2] + (int)PVar3;
  }
  return PVar3;
}

Assistant:

static PHYSFS_sint64 UNPK_read(PHYSFS_Io *io, void *buffer, PHYSFS_uint64 len)
{
    UNPKfileinfo *finfo = (UNPKfileinfo *) io->opaque;
    const UNPKentry *entry = finfo->entry;
    const PHYSFS_uint64 bytesLeft = (PHYSFS_uint64)(entry->size-finfo->curPos);
    PHYSFS_sint64 rc;

    if (bytesLeft < len)
        len = bytesLeft;

    rc = finfo->io->read(finfo->io, buffer, len);
    if (rc > 0)
        finfo->curPos += (PHYSFS_uint32) rc;

    return rc;
}